

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.cpp
# Opt level: O3

void assignment(LexState *ls,LHS_assign *lh,int nvars)

{
  lu_byte *plVar1;
  byte bVar2;
  bool bVar3;
  int nexps;
  LHS_assign *pLVar4;
  FuncState *pFVar5;
  FuncState *fs;
  expdesc e;
  undefined1 local_40 [8];
  expdesc local_38;
  
  if (2 < (lh->v).k - VLOCAL) {
    luaX_syntaxerror(ls,"syntax error");
  }
  if ((ls->t).token == 0x2c) {
    luaX_next(ls);
    local_40 = (undefined1  [8])lh;
    suffixedexp(ls,&local_38);
    if (local_38.k != VINDEXED) {
      pFVar5 = ls->fs;
      bVar2 = pFVar5->freereg;
      bVar3 = false;
      pLVar4 = lh;
      do {
        while ((pLVar4->v).k != VINDEXED) {
LAB_00113fa3:
          pLVar4 = pLVar4->prev;
          if (pLVar4 == (LHS_assign *)0x0) {
            if (!bVar3) goto LAB_00113fd6;
            goto LAB_00113faf;
          }
        }
        if ((local_38.k == (pLVar4->v).u.ind.vt) && (local_38.u.info == (uint)(pLVar4->v).u.ind.t))
        {
          (pLVar4->v).u.ind.vt = '\a';
          (pLVar4->v).u.ind.t = bVar2;
          bVar3 = true;
        }
        if ((local_38.k != VLOCAL) || (local_38.u.info != (pLVar4->v).u.ind.idx)) goto LAB_00113fa3;
        *(ushort *)&(pLVar4->v).u = (ushort)bVar2;
        pLVar4 = pLVar4->prev;
        bVar3 = true;
      } while (pLVar4 != (LHS_assign *)0x0);
LAB_00113faf:
      luaK_codeABC(pFVar5,(uint)(local_38.k != VLOCAL) * 5,(uint)bVar2,local_38.u.info,0);
      luaK_reserveregs(pFVar5,1);
    }
LAB_00113fd6:
    if (200 < (int)((uint)ls->L->nCcalls + nvars)) {
      errorlimit(ls->fs,200,"C levels");
    }
    assignment(ls,(LHS_assign *)local_40,nvars + 1);
  }
  else {
    checknext(ls,0x3d);
    nexps = explist(ls,(expdesc *)local_40);
    if (nvars == nexps) {
      luaK_setoneret(ls->fs,(expdesc *)local_40);
      pFVar5 = ls->fs;
      goto LAB_0011406d;
    }
    adjust_assign((LexState *)ls->fs,nvars,nexps,(expdesc *)local_40);
    if (nvars < nexps) {
      plVar1 = &ls->fs->freereg;
      *plVar1 = *plVar1 + ((char)nvars - (char)nexps);
    }
  }
  pFVar5 = ls->fs;
  local_38.k = pFVar5->freereg - VNIL;
  local_38.u.nval = -NAN;
  local_40._0_4_ = 6;
LAB_0011406d:
  luaK_storevar(pFVar5,&lh->v,(expdesc *)local_40);
  return;
}

Assistant:

static void assignment (LexState *ls, struct LHS_assign *lh, int nvars) {
  expdesc e;
  check_condition(ls, vkisvar(lh->v.k), "syntax error");
  if (testnext(ls, ',')) {  /* assignment -> ',' suffixedexp assignment */
    struct LHS_assign nv;
    nv.prev = lh;
    suffixedexp(ls, &nv.v);
    if (nv.v.k != VINDEXED)
      check_conflict(ls, lh, &nv.v);
    checklimit(ls->fs, nvars + ls->L->nCcalls, LUAI_MAXCCALLS,
                    "C levels");
    assignment(ls, &nv, nvars+1);
  }
  else {  /* assignment -> `=' explist */
    int nexps;
    checknext(ls, '=');
    nexps = explist(ls, &e);
    if (nexps != nvars) {
      adjust_assign(ls, nvars, nexps, &e);
      if (nexps > nvars)
        ls->fs->freereg -= nexps - nvars;  /* remove extra values */
    }
    else {
      luaK_setoneret(ls->fs, &e);  /* close last expression */
      luaK_storevar(ls->fs, &lh->v, &e);
      return;  /* avoid default */
    }
  }
  init_exp(&e, VNONRELOC, ls->fs->freereg-1);  /* default assignment */
  luaK_storevar(ls->fs, &lh->v, &e);
}